

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

void Cnf_DeriveFastMark(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint local_60;
  int Counter;
  int nFans;
  int k;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObjC;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Vec_Int_t *vSupps;
  Aig_Man_t *p_local;
  
  vSupps = (Vec_Int_t *)p;
  vNodes = Vec_PtrAlloc(100);
  pObj = (Aig_Obj_t *)Vec_PtrAlloc(100);
  iVar2 = Aig_ManObjNumMax((Aig_Man_t *)vSupps);
  vLeaves = (Vec_Ptr_t *)Vec_IntStart(iVar2);
  for (nFans = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupps + 1)), nFans < iVar2; nFans = nFans + 1
      ) {
    pTemp = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vSupps + 1),nFans);
    *(ulong *)&pTemp->field_0x18 = *(ulong *)&pTemp->field_0x18 & 0xffffffffffffffef | 0x10;
  }
  for (nFans = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vSupps[1].pArray), nFans < iVar2;
      nFans = nFans + 1) {
    pTemp = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vSupps[1].pArray,nFans);
    pAVar4 = Aig_ObjFanin0(pTemp);
    *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
  }
  for (nFans = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupps + 2)), nFans < iVar2; nFans = nFans + 1
      ) {
    pTemp = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vSupps + 2),nFans);
    if ((pTemp != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pTemp), iVar2 != 0)) {
      if ((*(ulong *)&pTemp->field_0x18 >> 5 & 1) != 0) {
        __assert_fail("!pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                      ,0x13f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
      }
      iVar2 = Aig_ObjIsMuxType(pTemp);
      if ((((iVar2 != 0) &&
           (pObj1 = Aig_ObjFanin0(pTemp), (*(ulong *)&pObj1->field_0x18 >> 5 & 1) == 0)) &&
          (iVar2 = Aig_ObjRefs(pObj1), iVar2 < 2)) &&
         ((_k = Aig_ObjFanin1(pTemp), (*(ulong *)&_k->field_0x18 >> 5 & 1) == 0 &&
          (iVar2 = Aig_ObjRefs(_k), iVar2 < 2)))) {
        *(ulong *)&pTemp->field_0x18 = *(ulong *)&pTemp->field_0x18 & 0xffffffffffffffdf | 0x20;
        *(ulong *)&pObj1->field_0x18 = *(ulong *)&pObj1->field_0x18 & 0xffffffffffffffdf | 0x20;
        *(ulong *)&_k->field_0x18 = *(ulong *)&_k->field_0x18 & 0xffffffffffffffdf | 0x20;
        *(ulong *)&pTemp->field_0x18 = *(ulong *)&pTemp->field_0x18 & 0xffffffffffffffef | 0x10;
        pAVar4 = Aig_ObjFanin0(pObj1);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
        pAVar4 = Aig_ObjFanin1(pObj1);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
        pAVar4 = Aig_ObjFanin0(_k);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
        pAVar4 = Aig_ObjFanin1(_k);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
      }
    }
  }
  for (nFans = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupps + 2)), nFans < iVar2; nFans = nFans + 1
      ) {
    pTemp = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vSupps + 2),nFans);
    if ((pTemp != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pTemp), iVar2 != 0)) {
      iVar2 = Aig_ObjRefs(pTemp);
      if (1 < iVar2) {
        *(ulong *)&pTemp->field_0x18 = *(ulong *)&pTemp->field_0x18 & 0xffffffffffffffef | 0x10;
      }
      iVar2 = Aig_ObjFaninC0(pTemp);
      if ((iVar2 != 0) &&
         (pAVar4 = Aig_ObjFanin0(pTemp), (*(ulong *)&pAVar4->field_0x18 >> 5 & 1) == 0)) {
        pAVar4 = Aig_ObjFanin0(pTemp);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
      }
      iVar2 = Aig_ObjFaninC1(pTemp);
      if ((iVar2 != 0) &&
         (pAVar4 = Aig_ObjFanin1(pTemp), (*(ulong *)&pAVar4->field_0x18 >> 5 & 1) == 0)) {
        pAVar4 = Aig_ObjFanin1(pTemp);
        *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
      }
    }
  }
  nFans = 0;
  do {
    iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupps + 2));
    if (iVar2 <= nFans) {
      Aig_ManCleanMarkB((Aig_Man_t *)vSupps);
      local_60 = 0;
      for (nFans = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vSupps[1].pArray), nFans < iVar2;
          nFans = nFans + 1) {
        pTemp = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vSupps[1].pArray,nFans);
        pAVar4 = Aig_ObjFanin0(pTemp);
        local_60 = (((*(ulong *)&pAVar4->field_0x18 >> 4 & 1) != 0 ^ 0xffU) & 1) + local_60;
      }
      if (local_60 != 0) {
        printf("PO-driver rule is violated %d times.\n",(ulong)local_60);
      }
      local_60 = 0;
      nFans = 0;
      do {
        iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(vSupps + 2));
        if (iVar2 <= nFans) {
          if (local_60 != 0) {
            printf("AND-gate rule is violated %d times.\n",(ulong)local_60);
          }
          Vec_PtrFree(vNodes);
          Vec_PtrFree((Vec_Ptr_t *)pObj);
          Vec_IntFree((Vec_Int_t *)vLeaves);
          return;
        }
        pTemp = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vSupps + 2),nFans);
        if ((pTemp != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pTemp), iVar2 != 0)) {
          if ((*(ulong *)&pTemp->field_0x18 >> 5 & 1) != 0) {
            __assert_fail("pObj->fMarkB == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                          ,0x19f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          if ((*(ulong *)&pTemp->field_0x18 >> 4 & 1) != 0) {
            Cnf_CollectLeaves(pTemp,vNodes,0);
            iVar2 = Vec_PtrSize(vNodes);
            if (6 < iVar2) {
              Cnf_CollectVolume((Aig_Man_t *)vSupps,pTemp,vNodes,(Vec_Ptr_t *)pObj);
              for (Counter = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj), Counter < iVar2;
                  Counter = Counter + 1) {
                pObjC = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,Counter);
                iVar2 = Aig_ObjFaninC0(pObjC);
                if ((iVar2 != 0) &&
                   (pAVar4 = Aig_ObjFanin0(pObjC), (*(ulong *)&pAVar4->field_0x18 >> 4 & 1) == 0)) {
                  local_60 = local_60 + 1;
                }
                iVar2 = Aig_ObjFaninC1(pObjC);
                if ((iVar2 != 0) &&
                   (pAVar4 = Aig_ObjFanin1(pObjC), (*(ulong *)&pAVar4->field_0x18 >> 4 & 1) == 0)) {
                  local_60 = local_60 + 1;
                }
              }
            }
          }
        }
        nFans = nFans + 1;
      } while( true );
    }
    pTemp = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(vSupps + 2),nFans);
    if (((pTemp != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pTemp), iVar2 != 0)) &&
       ((*(ulong *)&pTemp->field_0x18 >> 4 & 1) != 0)) {
      if ((*(ulong *)&pTemp->field_0x18 >> 5 & 1) == 0) {
        Cnf_CollectLeaves(pTemp,vNodes,1);
        pVVar1 = vLeaves;
        iVar2 = Aig_ObjId(pTemp);
        iVar3 = Vec_PtrSize(vNodes);
        Vec_IntWriteEntry((Vec_Int_t *)pVVar1,iVar2,iVar3);
        iVar2 = Vec_PtrSize(vNodes);
        if (iVar2 < 6) {
          for (Counter = 0; iVar2 = Vec_PtrSize(vNodes), Counter < iVar2; Counter = Counter + 1) {
            pObjC = (Aig_Obj_t *)Vec_PtrEntry(vNodes,Counter);
            pObjC = Aig_Regular(pObjC);
            if ((*(ulong *)&pObjC->field_0x18 >> 4 & 1) == 0) {
              __assert_fail("pTemp->fMarkA",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                            ,0x186,"void Cnf_DeriveFastMark(Aig_Man_t *)");
            }
            if ((((*(ulong *)&pObjC->field_0x18 >> 5 & 1) == 0) &&
                (iVar2 = Aig_ObjIsCi(pObjC), iVar2 == 0)) &&
               (iVar2 = Aig_ObjRefs(pObjC), pVVar1 = vLeaves, iVar2 < 2)) {
              iVar2 = Aig_ObjId(pObjC);
              iVar2 = Vec_IntEntry((Vec_Int_t *)pVVar1,iVar2);
              if (iVar2 < 1) {
                __assert_fail("Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                              ,0x189,"void Cnf_DeriveFastMark(Aig_Man_t *)");
              }
              iVar2 = Vec_PtrSize(vNodes);
              pVVar1 = vLeaves;
              iVar3 = Aig_ObjId(pObjC);
              iVar3 = Vec_IntEntry((Vec_Int_t *)pVVar1,iVar3);
              pVVar1 = vLeaves;
              if (iVar2 + -1 + iVar3 < 7) {
                *(ulong *)&pObjC->field_0x18 = *(ulong *)&pObjC->field_0x18 & 0xffffffffffffffef;
                iVar2 = Aig_ObjId(pTemp);
                Vec_IntWriteEntry((Vec_Int_t *)pVVar1,iVar2,6);
                break;
              }
            }
          }
        }
      }
      else {
        iVar2 = Aig_ObjIsMuxType(pTemp);
        if (iVar2 != 0) {
          pObj0 = Aig_ObjRecognizeMux(pTemp,(Aig_Obj_t **)&k,&pObj1);
          pObj1 = Aig_Regular(pObj1);
          _k = Aig_Regular(_k);
          if ((*(ulong *)&pObj1->field_0x18 >> 4 & 1) == 0) {
            __assert_fail("pObj0->fMarkA",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                          ,0x16d,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          if ((*(ulong *)&_k->field_0x18 >> 4 & 1) == 0) {
            __assert_fail("pObj1->fMarkA",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                          ,0x16e,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          iVar2 = (pObj1 == _k) + 1;
          if ((((*(ulong *)&pObj1->field_0x18 >> 5 & 1) == 0) &&
              (iVar3 = Aig_ObjIsCi(pObj1), iVar3 == 0)) &&
             (iVar3 = Aig_ObjRefs(pObj1), pVVar1 = vLeaves, iVar3 == iVar2)) {
            iVar3 = Aig_ObjId(pObj1);
            iVar3 = Vec_IntEntry((Vec_Int_t *)pVVar1,iVar3);
            if (iVar3 < 3) {
              *(ulong *)&pObj1->field_0x18 = *(ulong *)&pObj1->field_0x18 & 0xffffffffffffffef;
              goto LAB_0067b99b;
            }
          }
          if ((((*(ulong *)&_k->field_0x18 >> 5 & 1) == 0) && (iVar3 = Aig_ObjIsCi(_k), iVar3 == 0))
             && (iVar3 = Aig_ObjRefs(_k), pVVar1 = vLeaves, iVar3 == iVar2)) {
            iVar2 = Aig_ObjId(_k);
            iVar2 = Vec_IntEntry((Vec_Int_t *)pVVar1,iVar2);
            if (iVar2 < 3) {
              *(ulong *)&_k->field_0x18 = *(ulong *)&_k->field_0x18 & 0xffffffffffffffef;
            }
          }
        }
      }
    }
LAB_0067b99b:
    nFans = nFans + 1;
  } while( true );
}

Assistant:

void Cnf_DeriveFastMark( Aig_Man_t * p )
{
    Vec_Int_t * vSupps;
    Vec_Ptr_t * vLeaves, * vNodes;
    Aig_Obj_t * pObj, * pTemp, * pObjC, * pObj0, * pObj1;
    int i, k, nFans, Counter;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vSupps  = Vec_IntStart( Aig_ManObjNumMax(p) );

    // mark CIs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark CO drivers
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 1;

    // mark MUX/XOR nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( !pObj->fMarkB );
        if ( !Aig_ObjIsMuxType(pObj) )
            continue;
        pObj0 = Aig_ObjFanin0(pObj);
        if ( pObj0->fMarkB || Aig_ObjRefs(pObj0) > 1 )
            continue;
        pObj1 = Aig_ObjFanin1(pObj);
        if ( pObj1->fMarkB || Aig_ObjRefs(pObj1) > 1 )
            continue;
        // mark nodes
        pObj->fMarkB = 1;
        pObj0->fMarkB = 1;
        pObj1->fMarkB = 1;
        // mark inputs and outputs
        pObj->fMarkA = 1;
        Aig_ObjFanin0(pObj0)->fMarkA = 1;
        Aig_ObjFanin1(pObj0)->fMarkA = 1;
        Aig_ObjFanin0(pObj1)->fMarkA = 1;
        Aig_ObjFanin1(pObj1)->fMarkA = 1;
    }

    // mark nodes with multiple fanouts and pointed to by complemented edges
    Aig_ManForEachNode( p, pObj, i )
    {
        // mark nodes with many fanouts
        if ( Aig_ObjRefs(pObj) > 1 )
            pObj->fMarkA = 1;
        // mark nodes pointed to by a complemented edge
        if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkB )
            Aig_ObjFanin0(pObj)->fMarkA = 1;
        if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
            Aig_ObjFanin1(pObj)->fMarkA = 1;
    }

    // compute supergate size for internal marked nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        if ( pObj->fMarkB )
        {
            if ( !Aig_ObjIsMuxType(pObj) )
                continue;
            pObjC = Aig_ObjRecognizeMux( pObj, &pObj1, &pObj0 );
            pObj0 = Aig_Regular(pObj0);
            pObj1 = Aig_Regular(pObj1);
            assert( pObj0->fMarkA );
            assert( pObj1->fMarkA );
//            if ( pObj0 == pObj1 )
//                continue;
            nFans = 1 + (pObj0 == pObj1);
            if ( !pObj0->fMarkB && !Aig_ObjIsCi(pObj0) && Aig_ObjRefs(pObj0) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj0)) < 3 )
            {
                pObj0->fMarkA = 0;
                continue;
            }
            if ( !pObj1->fMarkB && !Aig_ObjIsCi(pObj1) && Aig_ObjRefs(pObj1) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj1)) < 3 )
            {
                pObj1->fMarkA = 0;
                continue;
            }
            continue;
        }

        Cnf_CollectLeaves( pObj, vLeaves, 1 );
        Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), Vec_PtrSize(vLeaves) );
        if ( Vec_PtrSize(vLeaves) >= 6 )
            continue;
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pTemp, k )
        {
            pTemp = Aig_Regular(pTemp);
            assert( pTemp->fMarkA );
            if ( pTemp->fMarkB || Aig_ObjIsCi(pTemp) || Aig_ObjRefs(pTemp) > 1 )
                continue;
            assert( Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0 );
            if ( Vec_PtrSize(vLeaves) - 1 + Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 6 )
                continue;
            pTemp->fMarkA = 0;
            Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), 6 );
//printf( "%d %d   ", Vec_PtrSize(vLeaves), Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) );
            break;
        }
    }
    Aig_ManCleanMarkB( p );

    // check CO drivers
    Counter = 0;
    Aig_ManForEachCo( p, pObj, i )
        Counter += !Aig_ObjFanin0(pObj)->fMarkA;
    if ( Counter )
    printf( "PO-driver rule is violated %d times.\n", Counter );

    // check that the AND-gates are fine
    Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        if ( Vec_PtrSize(vLeaves) <= 6 )
            continue;
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, k )
        {
            if ( Aig_ObjFaninC0(pTemp) && !Aig_ObjFanin0(pTemp)->fMarkA )
                Counter++;
            if ( Aig_ObjFaninC1(pTemp) && !Aig_ObjFanin1(pTemp)->fMarkA )
                Counter++;
        }
    }
    if ( Counter )
    printf( "AND-gate rule is violated %d times.\n", Counter );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vSupps );
}